

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64 *value,uint64 max_value)

{
  bool bVar1;
  string *in_RDI;
  Tokenizer *in_stack_00000028;
  undefined8 in_stack_ffffffffffffff58;
  ParserImpl *in_stack_ffffffffffffff60;
  ParserImpl *in_stack_ffffffffffffff70;
  uint64 *in_stack_ffffffffffffff78;
  uint64 in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  string local_40 [63];
  bool local_1;
  
  bVar1 = LookingAtType(in_stack_ffffffffffffff60,
                        (TokenType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  if (bVar1) {
    io::Tokenizer::current((Tokenizer *)&in_RDI[1]._M_string_length);
    bVar1 = io::Tokenizer::ParseInteger
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
    if (bVar1) {
      io::Tokenizer::Next(in_stack_00000028);
      local_1 = true;
    }
    else {
      io::Tokenizer::current((Tokenizer *)&in_RDI[1]._M_string_length);
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::operator+(in_RDI,(char *)in_stack_ffffffffffffff60);
      ReportError(in_stack_ffffffffffffff70,in_RDI);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      local_1 = false;
    }
  }
  else {
    io::Tokenizer::current((Tokenizer *)&in_RDI[1]._M_string_length);
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    ReportError(in_stack_ffffffffffffff70,in_RDI);
    std::__cxx11::string::~string(local_40);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ConsumeUnsignedInteger(uint64* value, uint64 max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError("Expected integer, got: " + tokenizer_.current().text);
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text, max_value,
                                     value)) {
      ReportError("Integer out of range (" + tokenizer_.current().text + ")");
      return false;
    }

    tokenizer_.Next();
    return true;
  }